

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brdf_plot.cpp
# Opt level: O0

void __thiscall brdf_plot::brdf_plot(brdf_plot *this)

{
  vec<3,_float,_(glm::precision)0> vVar1;
  undefined8 local_30;
  float local_28;
  vec<3,_float,_(glm::precision)0> local_1c;
  brdf_plot *local_10;
  brdf_plot *this_local;
  
  this->_size = 0x200;
  local_10 = this;
  glm::vec<3,_float,_(glm::precision)0>::vec(&this->_eye_position);
  glm::vec<3,_float,_(glm::precision)0>::vec(&this->_eye_target);
  glm::vec<3,_float,_(glm::precision)0>::vec(&this->_sphere_origin);
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_1c,-1.0,1.0,0.0);
  vVar1 = glm::normalize<3,float,(glm::precision)0,glm::vec>(&local_1c);
  local_30 = vVar1.field_0._0_8_;
  *(undefined8 *)&(this->_view_dir).field_0 = local_30;
  local_28 = vVar1.field_0._8_4_;
  (this->_view_dir).field_0.field_0.z = local_28;
  glm::mat<4,_4,_float,_(glm::precision)0>::mat(&this->_view_matrix_inv);
  return;
}

Assistant:

brdf_plot::brdf_plot():
  _size{512},
  _view_dir{glm::normalize(glm::vec3{-1.0f, 1.0f, 0.0f})}
{
}